

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O1

void testrand_bytes_test(uchar *bytes,size_t len)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  memset(bytes,0,len);
  uVar3 = len << 3;
  if (uVar3 != 0) {
    uVar10 = 0;
    do {
      uVar7 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      uVar11 = secp256k1_test_state[1] ^ secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar4 = secp256k1_test_state[0] ^ uVar7;
      uVar8 = uVar7 << 0x2d | uVar7 >> 0x13;
      uVar7 = uVar8 + uVar4;
      uVar8 = uVar8 ^ uVar11;
      uVar6 = secp256k1_test_state[2] ^ secp256k1_test_state[0] ^ secp256k1_test_state[1] << 0x11 ^
              uVar4;
      uVar9 = uVar11 ^ uVar6;
      uVar5 = uVar4 ^ uVar8;
      uVar8 = uVar8 << 0x2d | uVar8 >> 0x13;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = ((uVar7 * 0x800000 | uVar7 >> 0x29) + uVar4 >> 0x3b) *
                     (((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                      secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                      secp256k1_test_state[0] >> 0x3a) + 0x10;
      iVar2 = SUB164(auVar1 * ZEXT816(0x842108421084211),8) + 1;
      uVar7 = uVar8 + uVar5;
      uVar4 = uVar6 ^ uVar11 << 0x11 ^ uVar5;
      secp256k1_test_state[1] = uVar4 ^ uVar9;
      secp256k1_test_state[2] = uVar4 ^ uVar9 << 0x11;
      do {
        bytes[uVar10 >> 3] =
             bytes[uVar10 >> 3] |
             (byte)((uVar7 * 0x800000 | uVar7 >> 0x29) + uVar5 >> 0x3f) << ((byte)uVar10 & 7);
        uVar10 = uVar10 + 1;
        if (iVar2 < 2) break;
        iVar2 = iVar2 + -1;
      } while (uVar10 < uVar3);
      uVar9 = uVar9 ^ uVar8;
      secp256k1_test_state[0] = uVar5 ^ uVar9;
      secp256k1_test_state[3] = uVar9 << 0x2d | uVar9 >> 0x13;
    } while (uVar10 < uVar3);
  }
  return;
}

Assistant:

static void testrand_bytes_test(unsigned char *bytes, size_t len) {
    size_t bits = 0;
    memset(bytes, 0, len);
    while (bits < len * 8) {
        int now;
        uint32_t val;
        now = 1 + (testrand_bits(6) * testrand_bits(5) + 16) / 31;
        val = testrand_bits(1);
        while (now > 0 && bits < len * 8) {
            bytes[bits / 8] |= val << (bits % 8);
            now--;
            bits++;
        }
    }
}